

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derived_classes.cpp
# Opt level: O0

void __thiscall Derived21::Print(Derived21 *this)

{
  int iVar1;
  ostream *poVar2;
  Base1 *pBVar3;
  Base2 *in_RDI;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Derived21 (");
  iVar1 = Base2::id(in_RDI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"): ");
  pBVar3 = Base2::printer(in_RDI);
  (*pBVar3->_vptr_Base1[2])();
  return;
}

Assistant:

void Derived21::Print() const {
  std::cout << "Derived21 (" << id() << "): ";
  printer()->Print();
}